

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  allocator<char> local_31;
  string pattern;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&pattern," \t\f\v\n\r",&local_31);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  lVar1 = std::__cxx11::string::find_last_not_of((string *)__return_storage_ptr__,(ulong)&pattern);
  if (lVar1 == -1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar1 + 1);
  }
  lVar1 = std::__cxx11::string::find_first_not_of((string *)__return_storage_ptr__,(ulong)&pattern);
  if (lVar1 == -1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  std::__cxx11::string::~string((string *)&pattern);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string &str)
{
	const std::string pattern = " \t\f\v\n\r";
	std::string ret = str;
	std::size_t found;

	found = ret.find_last_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(found + 1, ret.length() - found);
	}

	found = ret.find_first_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(0, found);
	}

    return ret;
}